

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O1

void __thiscall wasm::SimplifyGlobals::preferEarlierImports(SimplifyGlobals *this)

{
  pointer puVar1;
  Expression *pEVar2;
  char *pcVar3;
  Global *pGVar4;
  mapped_type *pmVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar8;
  undefined1 auStack_198 [8];
  Name child;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  Expression **local_168;
  size_t sStack_160;
  pointer local_b8;
  pointer pTStack_b0;
  pointer local_a8;
  Function *pFStack_a0;
  Module *local_98;
  undefined1 *local_90;
  size_t sStack_88;
  Name parent;
  undefined1 local_70 [8];
  NameNameMap copiedParentMap;
  
  copiedParentMap._M_t._M_impl._0_4_ = 0;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar8 = (this->module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&copiedParentMap;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&copiedParentMap
  ;
  if (puVar8 != puVar1) {
    do {
      pGVar4 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      auStack_198 = *(undefined1 (*) [8])&(pGVar4->super_Importable).super_Named;
      child.super_IString.str._M_len =
           *(size_t *)((long)&(pGVar4->super_Importable).super_Named + 8);
      pGVar4 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (((pGVar4->mutable_ == false) &&
          (*(char **)((long)&(pGVar4->super_Importable).module + 8) == (char *)0x0)) &&
         (pEVar2 = pGVar4->init, pEVar2->_id == GlobalGetId)) {
        sStack_88 = *(size_t *)(pEVar2 + 1);
        parent.super_IString.str._M_len = pEVar2[1].type.id;
        pGVar4 = Module::getGlobal(this->module,(IString)*(IString *)&pEVar2[1]._id);
        if (pGVar4->mutable_ == false) {
          pmVar5 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)local_70,(key_type *)auStack_198);
          (pmVar5->super_IString).str._M_len = sStack_88;
          (pmVar5->super_IString).str._M_str = (char *)parent.super_IString.str._M_len;
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  if (copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    puVar8 = (this->module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(this->module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar8 != (pointer)copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      do {
        pGVar4 = (puVar8->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        auStack_198 = *(undefined1 (*) [8])&(pGVar4->super_Importable).super_Named;
        child.super_IString.str._M_len =
             *(size_t *)((long)&(pGVar4->super_Importable).super_Named + 8);
        cVar6 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                        *)local_70,(key_type *)auStack_198);
        if (cVar6._M_node != (_Base_ptr)&copiedParentMap) {
          while( true ) {
            pmVar5 = std::
                     map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                   *)local_70,(key_type *)auStack_198);
            cVar6 = std::
                    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                            *)local_70,pmVar5);
            if (cVar6._M_node == (_Base_ptr)&copiedParentMap) break;
            pmVar5 = std::
                     map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                   *)local_70,(key_type *)auStack_198);
            pmVar5 = std::
                     map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                   *)local_70,pmVar5);
            pmVar7 = std::
                     map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                   *)local_70,(key_type *)auStack_198);
            pcVar3 = (pmVar5->super_IString).str._M_str;
            (pmVar7->super_IString).str._M_len = (pmVar5->super_IString).str._M_len;
            (pmVar7->super_IString).str._M_str = pcVar3;
          }
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != (pointer)copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    local_178._M_local_buf[0] = '\0';
    local_168 = (Expression **)0x0;
    sStack_160 = 0;
    local_b8 = (pointer)0x0;
    pTStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    pFStack_a0 = (Function *)0x0;
    local_98 = (Module *)0x0;
    auStack_198 = (undefined1  [8])&PTR__WalkerPass_00d8b298;
    local_90 = local_70;
    child.super_IString.str._M_len = (size_t)(this->super_Pass).runner;
    child.super_IString.str._M_str = (char *)&local_178;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
           *)auStack_198,this->module);
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    auStack_198 = (undefined1  [8])&PTR__Pass_00d87048;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)child.super_IString.str._M_str != &local_178) {
      operator_delete(child.super_IString.str._M_str,
                      CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1)
      ;
    }
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_70);
  return;
}

Assistant:

void preferEarlierImports() {
    // Optimize uses of immutable globals, prefer the earlier import when
    // there is a copy.
    NameNameMap copiedParentMap;
    for (auto& global : module->globals) {
      auto child = global->name;
      if (!global->mutable_ && !global->imported()) {
        if (auto* get = global->init->dynCast<GlobalGet>()) {
          auto parent = get->name;
          if (!module->getGlobal(get->name)->mutable_) {
            copiedParentMap[child] = parent;
          }
        }
      }
    }
    if (!copiedParentMap.empty()) {
      // Go all the way back.
      for (auto& global : module->globals) {
        auto child = global->name;
        if (copiedParentMap.count(child)) {
          while (copiedParentMap.count(copiedParentMap[child])) {
            copiedParentMap[child] = copiedParentMap[copiedParentMap[child]];
          }
        }
      }
      // Apply to the gets.
      GlobalUseModifier(&copiedParentMap).run(getPassRunner(), module);
    }
  }